

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::CelsiusDebugBRegister::~CelsiusDebugBRegister(CelsiusDebugBRegister *this)

{
  CelsiusDebugBRegister *this_local;
  
  ~CelsiusDebugBRegister(this);
  operator_delete(this);
  return;
}

Assistant:

void write(int cnum, uint32_t val) override {
		// fuck you
		uint32_t mangled = val & 0x3fffffff;
		if (val & 1 << 30)
			mangled |= 1 << 31;
		if (val & 1 << 31)
			mangled |= 1 << 30;
		nva_wr32(cnum, addr, mangled);
	}